

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O2

int Abc_SuppFindVar(Vec_Wec_t *pS,Vec_Wec_t *pD,int nVars)

{
  int iVar1;
  int iVar2;
  int i;
  int iVar3;
  
  i = 0;
  if (nVars < 1) {
    nVars = 0;
  }
  iVar3 = -1;
  iVar2 = -1;
  do {
    if (nVars == i) {
      return iVar3;
    }
    iVar1 = Vec_WecLevelSize(pS,i);
    if (iVar1 == 0) {
      if (iVar3 != -1) {
        iVar1 = Vec_WecLevelSize(pD,i);
        if (iVar2 <= iVar1) goto LAB_003dba4e;
      }
      iVar2 = Vec_WecLevelSize(pD,i);
      iVar3 = i;
    }
LAB_003dba4e:
    i = i + 1;
  } while( true );
}

Assistant:

int Abc_SuppFindVar( Vec_Wec_t * pS, Vec_Wec_t * pD, int nVars )
{
    int v, vBest = -1, dBest = -1;
    for ( v = 0; v < nVars; v++ )
    {
        if ( Vec_WecLevelSize(pS, v) )
            continue;
        if ( vBest == -1 || dBest > Vec_WecLevelSize(pD, v) )
            vBest = v, dBest = Vec_WecLevelSize(pD, v);
    }
    return vBest;
}